

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

Fl_Menu_Item * __thiscall Fl_Menu_::find_item(Fl_Menu_ *this,Fl_Callback *cb)

{
  int iVar1;
  Fl_Menu_Item *m;
  int t;
  Fl_Callback *cb_local;
  Fl_Menu_ *this_local;
  
  m._4_4_ = 0;
  while( true ) {
    iVar1 = size(this);
    if (iVar1 <= m._4_4_) {
      return (Fl_Menu_Item *)0x0;
    }
    if (this->menu_[m._4_4_].callback_ == cb) break;
    m._4_4_ = m._4_4_ + 1;
  }
  return this->menu_ + m._4_4_;
}

Assistant:

const Fl_Menu_Item * Fl_Menu_::find_item(Fl_Callback *cb) {
  for ( int t=0; t < size(); t++ ) {
    const Fl_Menu_Item *m = menu_ + t;
    if (m->callback_==cb) {
      return m;
    }
  }
  return (const Fl_Menu_Item *)0;
}